

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFraig.c
# Opt level: O2

void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vFrontier)

{
  int iVar1;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Ivy_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                  ,0x9d9,
                  "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  if (*(int *)&pObj->pNextFan0 == 0) {
    if (pObj->pNextFan1 != (Ivy_Obj_t *)0x0) {
      __assert_fail("Ivy_ObjFaninVec(pObj) == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFraig.c"
                    ,0x9dd,
                    "void Ivy_FraigObjAddToFrontier(Ivy_FraigMan_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
    }
    if (pObj->Id != 0) {
      iVar1 = p->nSatVars;
      p->nSatVars = iVar1 + 1;
      pObj->pNextFan0 = (Ivy_Obj_t *)(long)iVar1;
      if (0xfffffffd < (*(uint *)&pObj->field_0x8 & 0xf) - 7) {
        Vec_PtrPush(vFrontier,pObj);
        return;
      }
    }
  }
  return;
}

Assistant:

void Ivy_FraigObjAddToFrontier( Ivy_FraigMan_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vFrontier )
{
    assert( !Ivy_IsComplement(pObj) );
    if ( Ivy_ObjSatNum(pObj) )
        return;
    assert( Ivy_ObjSatNum(pObj) == 0 );
    assert( Ivy_ObjFaninVec(pObj) == NULL );
    if ( Ivy_ObjIsConst1(pObj) )
        return;
//printf( "Assigning node %d number %d\n", pObj->Id, p->nSatVars );
    Ivy_ObjSetSatNum( pObj, p->nSatVars++ );
    if ( Ivy_ObjIsNode(pObj) )
        Vec_PtrPush( vFrontier, pObj );
}